

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

int main(void)

{
  i *piVar1;
  pointer pTVar2;
  pointer piVar3;
  pointer piVar4;
  anon_class_1_0_00000001 *in_RSI;
  long local_90;
  long local_80;
  long local_70;
  long local_60;
  undefined1 local_50 [8];
  unique_ptr<i2,_std::default_delete<i2>_> up2;
  undefined1 local_38 [8];
  unique_ptr<i1,_std::default_delete<i1>_> up1;
  unique_ptr<T,_std::default_delete<T>_> object;
  i injector;
  
  piVar1 = anon_class_1_0_00000001::operator()((i *)&module1,in_RSI);
  anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&module2);
  boost::ext::di::v1_3_0::make_injector<boost::ext::di::v1_3_0::config,_i,_i,_0,_0>(piVar1);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i,_i>
  ::create<std::unique_ptr<T,_std::default_delete<T>_>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i,_i>
              *)&up1);
  pTVar2 = std::unique_ptr<T,_std::default_delete<T>_>::operator->
                     ((unique_ptr<T,_std::default_delete<T>_> *)&up1);
  piVar3 = std::unique_ptr<i1,_std::default_delete<i1>_>::get(&pTVar2->i1_);
  if (piVar3 == (pointer)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(piVar3,&i1::typeinfo,&impl1::typeinfo,0);
  }
  if (local_60 == 0) {
    __assert_fail("dynamic_cast<impl1*>(object->i1_.get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                  ,0x38,"int main()");
  }
  pTVar2 = std::unique_ptr<T,_std::default_delete<T>_>::operator->
                     ((unique_ptr<T,_std::default_delete<T>_> *)&up1);
  piVar4 = std::unique_ptr<i2,_std::default_delete<i2>_>::get(&pTVar2->i2_);
  if (piVar4 == (pointer)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = __dynamic_cast(piVar4,&i2::typeinfo,&impl2::typeinfo,0);
  }
  if (local_70 != 0) {
    pTVar2 = std::unique_ptr<T,_std::default_delete<T>_>::operator->
                       ((unique_ptr<T,_std::default_delete<T>_> *)&up1);
    if (pTVar2->i != 0x2a) {
      __assert_fail("42 == object->i",
                    "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                    ,0x3a,"int main()");
    }
    boost::ext::di::v1_3_0::core::
    injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i,_i>
    ::create<std::unique_ptr<i1,_std::default_delete<i1>_>,_0>
              ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i,_i>
                *)local_38);
    piVar3 = std::unique_ptr<i1,_std::default_delete<i1>_>::get
                       ((unique_ptr<i1,_std::default_delete<i1>_> *)local_38);
    if (piVar3 == (pointer)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = __dynamic_cast(piVar3,&i1::typeinfo,&impl1::typeinfo,0);
    }
    if (local_80 != 0) {
      boost::ext::di::v1_3_0::core::
      injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i,_i>
      ::create<std::unique_ptr<i2,_std::default_delete<i2>_>,_0>
                ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i,_i>
                  *)local_50);
      piVar4 = std::unique_ptr<i2,_std::default_delete<i2>_>::get
                         ((unique_ptr<i2,_std::default_delete<i2>_> *)local_50);
      if (piVar4 == (pointer)0x0) {
        local_90 = 0;
      }
      else {
        local_90 = __dynamic_cast(piVar4,&i2::typeinfo,&impl2::typeinfo,0);
      }
      if (local_90 != 0) {
        std::unique_ptr<i2,_std::default_delete<i2>_>::~unique_ptr
                  ((unique_ptr<i2,_std::default_delete<i2>_> *)local_50);
        std::unique_ptr<i1,_std::default_delete<i1>_>::~unique_ptr
                  ((unique_ptr<i1,_std::default_delete<i1>_> *)local_38);
        std::unique_ptr<T,_std::default_delete<T>_>::~unique_ptr
                  ((unique_ptr<T,_std::default_delete<T>_> *)&up1);
        return 0;
      }
      __assert_fail("dynamic_cast<impl2*>(up2.get())",
                    "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                    ,0x3e,"int main()");
    }
    __assert_fail("dynamic_cast<impl1*>(up1.get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                  ,0x3c,"int main()");
  }
  __assert_fail("dynamic_cast<impl2*>(object->i2_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                ,0x39,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module1(), module2());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->i1_.get()));
  assert(dynamic_cast<impl2*>(object->i2_.get()));
  assert(42 == object->i);
  auto up1 = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(up1.get()));
  auto up2 = injector.create<std::unique_ptr<i2>>();
  assert(dynamic_cast<impl2*>(up2.get()));
}